

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void debug(int level,char *file,int line,string *msg)

{
  ostream *poVar1;
  string local_48 [8];
  string level_head;
  string *msg_local;
  int line_local;
  char *file_local;
  int level_local;
  
  std::__cxx11::string::string(local_48);
  if (level == 1) {
    std::__cxx11::string::operator=(local_48,"\x1b[31m[error]\x1b[0m ");
  }
  else if (level == 2) {
    std::__cxx11::string::operator=(local_48,"\x1b[33m[warn]\x1b[0m ");
  }
  else if (level == 4) {
    std::__cxx11::string::operator=(local_48,"\x1b[32m[info]\x1b[0m ");
  }
  else {
    std::__cxx11::string::operator=(local_48,"[unknow]");
  }
  if ((level & 7U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,local_48);
    poVar1 = std::operator<<(poVar1,file);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,(string *)msg);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void debug(const int level, const char *file, int line, std::string msg) {
    std::string level_head;
    switch (level) {
        case INFO_FLAG:level_head = "\033[32m[info]\033[0m ";
            break;
        case WARN_FLAG:level_head = "\033[33m[warn]\033[0m ";
            break;
        case ERR_FLAG:level_head = "\033[31m[error]\033[0m ";
            break;
        default:level_head = "[unknow]";
            break;
    }

    if (level & DEBUG) {
        std::cout << level_head << file << ":" << line << ": " << msg
                  << std::endl;
    }
}